

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

QPainterPath __thiscall
QPainterPathStroker::createStroke(QPainterPathStroker *this,QPainterPath *path)

{
  QStroker *stroker;
  QPainterPathPrivate *pQVar1;
  long lVar2;
  QExplicitlySharedDataPointer<QPainterPathPrivate> *in_RDX;
  qreal *pqVar3;
  QTransform *pQVar4;
  QDashStroker *pQVar5;
  long in_FS_OFFSET;
  byte bVar6;
  QPainterPath stroke;
  QDashStroker dashStroker;
  QExplicitlySharedDataPointer<QPainterPathPrivate> local_138;
  QTransform local_130;
  QDashStroker local_e0;
  long local_38;
  
  bVar6 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stroker = (QStroker *)(path->d_ptr).d.ptr;
  local_138.d.ptr = (totally_ordered_wrapper<QPainterPathPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_138);
  pQVar1 = (((QPainterPath *)in_RDX)->d_ptr).d.ptr;
  if ((pQVar1 != (QPainterPathPrivate *)0x0) &&
     (((pQVar1->elements).d.size != 1 || (((pQVar1->elements).d.ptr)->type != MoveToElement)))) {
    if (stroker[1].super_QStrokerOps.m_elements.siz == 0) {
      pqVar3 = (qreal *)&DAT_006a06c8;
      pQVar5 = &local_e0;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pQVar5->super_QStrokerOps)._vptr_QStrokerOps = (_func_int **)*pqVar3;
        pqVar3 = pqVar3 + (ulong)bVar6 * -2 + 1;
        pQVar5 = (QDashStroker *)((long)pQVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      local_e0.super_QStrokerOps.m_dashThreshold._0_2_ = 0;
      QStrokerOps::strokePath
                ((QStrokerOps *)stroker,(QPainterPath *)in_RDX,&local_138,(QTransform *)&local_e0);
    }
    else {
      memcpy(&local_e0,&DAT_006a0620,0xa8);
      QDashStroker::QDashStroker(&local_e0,stroker);
      QArrayDataPointer<double>::operator=
                (&local_e0.m_dashPattern.d,(QArrayDataPointer<double> *)(stroker + 1));
      local_e0.m_dashOffset = (qreal)stroker[1].super_QStrokerOps.m_elements.buffer;
      local_e0.super_QStrokerOps.m_clip_rect.xp = (stroker->super_QStrokerOps).m_clip_rect.xp;
      local_e0.super_QStrokerOps.m_clip_rect.yp = (stroker->super_QStrokerOps).m_clip_rect.yp;
      local_e0.super_QStrokerOps.m_clip_rect.w = (stroker->super_QStrokerOps).m_clip_rect.w;
      local_e0.super_QStrokerOps.m_clip_rect.h = (stroker->super_QStrokerOps).m_clip_rect.h;
      pqVar3 = (qreal *)&DAT_006a06c8;
      pQVar4 = &local_130;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pQVar4->m_matrix[0][0] = *pqVar3;
        pqVar3 = pqVar3 + (ulong)bVar6 * -2 + 1;
        pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      local_130._72_2_ = 0;
      QStrokerOps::strokePath
                (&local_e0.super_QStrokerOps,(QPainterPath *)in_RDX,&local_138,&local_130);
      QDashStroker::~QDashStroker(&local_e0);
    }
    QPainterPath::setFillRule((QPainterPath *)&local_138,WindingFill);
    in_RDX = &local_138;
  }
  QPainterPath::QPainterPath((QPainterPath *)this,(QPainterPath *)in_RDX);
  QPainterPath::~QPainterPath((QPainterPath *)&local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
}

Assistant:

QPainterPath QPainterPathStroker::createStroke(const QPainterPath &path) const
{
    QPainterPathStrokerPrivate *d = const_cast<QPainterPathStrokerPrivate *>(d_func());
    QPainterPath stroke;
    if (path.isEmpty())
        return path;
    if (d->dashPattern.isEmpty()) {
        d->stroker.strokePath(path, &stroke, QTransform());
    } else {
        QDashStroker dashStroker(&d->stroker);
        dashStroker.setDashPattern(d->dashPattern);
        dashStroker.setDashOffset(d->dashOffset);
        dashStroker.setClipRect(d->stroker.clipRect());
        dashStroker.strokePath(path, &stroke, QTransform());
    }
    stroke.setFillRule(Qt::WindingFill);
    return stroke;
}